

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

void __thiscall
capnp::InputStreamMessageReader::InputStreamMessageReader
          (InputStreamMessageReader *this,InputStream *inputStream,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  uint uVar1;
  kj *this_00;
  DirectWireValue<unsigned_int> *pDVar2;
  size_t sVar3;
  DirectWireValue<unsigned_int> *pDVar4;
  WiderType<Decay<unsigned_int_&>,_Decay<unsigned_long_&>_> WVar5;
  Exception *pEVar6;
  ArrayPtr<const_capnp::word> *pAVar7;
  word *pwVar8;
  uchar *puVar9;
  ssize_t sVar10;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar11;
  ReaderOptions options_00;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> AVar12;
  ArrayPtr<capnp::word> AVar13;
  ArrayPtr<const_capnp::word> AVar14;
  uint local_1c0;
  ArrayPtr<unsigned_char> local_1a0;
  ArrayPtr<capnp::word> local_190;
  ArrayPtr<const_capnp::word> local_180;
  uint local_170;
  uint local_16c;
  uint segmentSize;
  uint i_1;
  size_t offset;
  ArrayPtr<capnp::word> local_148;
  ArrayPtr<const_capnp::word> local_138;
  ArrayPtr<capnp::word> local_128;
  Array<capnp::word> local_118;
  Fault local_100;
  Fault f_1;
  undefined1 auStack_f0 [4];
  uint i;
  ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> moreSizes;
  Array<capnp::_::DirectWireValue<unsigned_int>_> moreSizes_heap;
  WireValue<uint32_t> moreSizes_stack [16];
  bool moreSizes_isOnStack;
  size_t moreSizes_size;
  Fault f;
  size_t totalWords;
  uint local_60;
  uint segment0Size;
  uint segmentCount;
  WireValue<uint32_t> firstWord [2];
  InputStream *inputStream_local;
  InputStreamMessageReader *this_local;
  ArrayPtr<capnp::word> scratchSpace_local;
  ReaderOptions options_local;
  
  scratchSpace_local.ptr = (word *)scratchSpace.size_;
  this_local = (InputStreamMessageReader *)scratchSpace.ptr;
  sVar11 = options._8_8_;
  scratchSpace_local.size_ = options.traversalLimitInWords;
  options_00._12_4_ = 0;
  options_00.traversalLimitInWords = SUB128(options._0_12_,0);
  options_00.nestingLimit = SUB124(options._0_12_,8);
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_00631260;
  this->inputStream = inputStream;
  this->readPos = (byte *)0x0;
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::Array(&this->moreSegments);
  kj::Array<capnp::word>::Array(&this->ownedSpace);
  kj::UnwindDetector::UnwindDetector(&this->unwindDetector);
  kj::InputStream::read(inputStream,(int)&segment0Size,(void *)0x8,sVar11);
  local_60 = capnp::_::DirectWireValue<unsigned_int>::get
                       ((DirectWireValue<unsigned_int> *)&segment0Size);
  local_60 = local_60 + 1;
  if (local_60 == 0) {
    local_1c0 = 0;
    sVar3 = extraout_RDX;
  }
  else {
    local_1c0 = capnp::_::DirectWireValue<unsigned_int>::get
                          ((DirectWireValue<unsigned_int> *)&segmentCount);
    sVar3 = extraout_RDX_00;
  }
  totalWords._4_4_ = local_1c0;
  f.exception = (Exception *)(ulong)local_1c0;
  if (0x1ff < local_60) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
              ((Fault *)&moreSizes_size,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xba,FAILED,"segmentCount < 512","\"Message has too many segments.\"",
               (char (*) [31])"Message has too many segments.");
    local_60 = 1;
    totalWords._4_4_ = 1;
    kj::_::Debug::Fault::~Fault((Fault *)&moreSizes_size);
    sVar3 = extraout_RDX_01;
  }
  this_00 = (kj *)(ulong)(local_60 & 0xfffffffe);
  if (this_00 < (kj *)0x11) {
    kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::Array
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_,(void *)0x0);
    AVar12 = kj::arrayPtr<capnp::_::DirectWireValue<unsigned_int>>
                       ((DirectWireValue<unsigned_int> *)&moreSizes_heap.disposer,(size_t)this_00);
    _auStack_f0 = AVar12.ptr;
  }
  else {
    kj::heapArray<capnp::_::DirectWireValue<unsigned_int>>
              ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_,this_00,sVar3);
    AVar12 = kj::Array::operator_cast_to_ArrayPtr((Array *)&moreSizes.size_);
    _auStack_f0 = AVar12.ptr;
  }
  moreSizes.ptr = (DirectWireValue<unsigned_int> *)AVar12.size_;
  pDVar4 = AVar12.ptr;
  if (1 < local_60) {
    pDVar2 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::begin
                       ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0);
    sVar3 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::size
                      ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0);
    kj::InputStream::read(inputStream,(int)pDVar2,(void *)(sVar3 << 2),(size_t)pDVar4);
    for (f_1.exception._4_4_ = 0; f_1.exception._4_4_ < local_60 - 1;
        f_1.exception._4_4_ = f_1.exception._4_4_ + 1) {
      pDVar4 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0,
                          (ulong)f_1.exception._4_4_);
      uVar1 = capnp::_::DirectWireValue<unsigned_int>::get(pDVar4);
      f.exception = (Exception *)((long)(f.exception)->trace + ((ulong)uVar1 - 0x50));
    }
  }
  if (scratchSpace_local.size_ < f.exception) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[93]>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
               ,0xce,FAILED,"totalWords <= options.traversalLimitInWords",
               "\"Message is too large.  To increase the limit on the receiving end, see \" \"capnp::ReaderOptions.\""
               ,(char (*) [93])
                "Message is too large.  To increase the limit on the receiving end, see capnp::ReaderOptions."
              );
    local_60 = 1;
    WVar5 = kj::min<unsigned_int&,unsigned_long&>
                      ((uint *)((long)&totalWords + 4),&scratchSpace_local.size_);
    totalWords._4_4_ = (uint)WVar5;
    f.exception = (Exception *)(WVar5 & 0xffffffff);
    kj::_::Debug::Fault::~Fault(&local_100);
  }
  pEVar6 = (Exception *)kj::ArrayPtr<capnp::word>::size((ArrayPtr<capnp::word> *)&this_local);
  AVar13.size_ = (size_t)scratchSpace_local.ptr;
  AVar13.ptr = (word *)this_local;
  if (pEVar6 < f.exception) {
    kj::heapArray<capnp::word>(&local_118,(size_t)f.exception);
    kj::Array<capnp::word>::operator=(&this->ownedSpace,&local_118);
    kj::Array<capnp::word>::~Array(&local_118);
    local_128 = kj::Array::operator_cast_to_ArrayPtr((Array *)&this->ownedSpace);
    AVar13 = local_128;
  }
  scratchSpace_local.ptr = (word *)AVar13.size_;
  this_local = (InputStreamMessageReader *)AVar13.ptr;
  local_148 = kj::ArrayPtr<capnp::word>::slice
                        ((ArrayPtr<capnp::word> *)&this_local,0,(ulong)totalWords._4_4_);
  local_138 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_148);
  sVar11 = local_138.size_;
  this->segment0 = local_138;
  if (1 < local_60) {
    kj::heapArray<kj::ArrayPtr<capnp::word_const>>
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&offset,(kj *)(ulong)(local_60 - 1),
               (size_t)local_138.ptr);
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator=
              (&this->moreSegments,(Array<kj::ArrayPtr<const_capnp::word>_> *)&offset);
    kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array
              ((Array<kj::ArrayPtr<const_capnp::word>_> *)&offset);
    _segmentSize = (ulong)totalWords._4_4_;
    for (local_16c = 0; sVar11 = (size_t)(local_60 - 1), local_16c < local_60 - 1;
        local_16c = local_16c + 1) {
      pDVar4 = kj::ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_>::operator[]
                         ((ArrayPtr<capnp::_::DirectWireValue<unsigned_int>_> *)auStack_f0,
                          (ulong)local_16c);
      local_170 = capnp::_::DirectWireValue<unsigned_int>::get(pDVar4);
      AVar13 = kj::ArrayPtr<capnp::word>::slice
                         ((ArrayPtr<capnp::word> *)&this_local,_segmentSize,_segmentSize + local_170
                         );
      local_190 = AVar13;
      AVar14 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_190);
      local_180 = AVar14;
      pAVar7 = kj::Array<kj::ArrayPtr<const_capnp::word>_>::operator[]
                         (&this->moreSegments,(ulong)local_16c);
      *pAVar7 = local_180;
      _segmentSize = local_170 + _segmentSize;
    }
  }
  if (local_60 == 1) {
    pwVar8 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)&this_local);
    kj::InputStream::read(inputStream,(int)pwVar8,(void *)((long)f.exception << 3),sVar11);
  }
  else if (1 < local_60) {
    local_1a0 = kj::ArrayPtr<capnp::word>::asBytes((ArrayPtr<capnp::word> *)&this_local);
    puVar9 = kj::ArrayPtr<unsigned_char>::begin(&local_1a0);
    this->readPos = puVar9;
    sVar10 = kj::InputStream::read
                       (inputStream,(int)this->readPos,(void *)((ulong)totalWords._4_4_ << 3),
                        (long)f.exception << 3);
    this->readPos = this->readPos + sVar10;
  }
  kj::Array<capnp::_::DirectWireValue<unsigned_int>_>::~Array
            ((Array<capnp::_::DirectWireValue<unsigned_int>_> *)&moreSizes.size_);
  return;
}

Assistant:

InputStreamMessageReader::InputStreamMessageReader(
    kj::InputStream& inputStream, ReaderOptions options, kj::ArrayPtr<word> scratchSpace)
    : MessageReader(options), inputStream(inputStream), readPos(nullptr) {
  _::WireValue<uint32_t> firstWord[2];

  inputStream.read(firstWord, sizeof(firstWord));

  uint segmentCount = firstWord[0].get() + 1;
  uint segment0Size = segmentCount == 0 ? 0 : firstWord[1].get();

  size_t totalWords = segment0Size;

  // Reject messages with too many segments for security reasons.
  KJ_REQUIRE(segmentCount < 512, "Message has too many segments.") {
    segmentCount = 1;
    segment0Size = 1;
    break;
  }

  // Read sizes for all segments except the first.  Include padding if necessary.
  KJ_STACK_ARRAY(_::WireValue<uint32_t>, moreSizes, segmentCount & ~1, 16, 64);
  if (segmentCount > 1) {
    inputStream.read(moreSizes.begin(), moreSizes.size() * sizeof(moreSizes[0]));
    for (uint i = 0; i < segmentCount - 1; i++) {
      totalWords += moreSizes[i].get();
    }
  }

  // Don't accept a message which the receiver couldn't possibly traverse without hitting the
  // traversal limit.  Without this check, a malicious client could transmit a very large segment
  // size to make the receiver allocate excessive space and possibly crash.
  KJ_REQUIRE(totalWords <= options.traversalLimitInWords,
             "Message is too large.  To increase the limit on the receiving end, see "
             "capnp::ReaderOptions.") {
    segmentCount = 1;
    segment0Size = kj::min(segment0Size, options.traversalLimitInWords);
    totalWords = segment0Size;
    break;
  }

  if (scratchSpace.size() < totalWords) {
    // TODO(perf):  Consider allocating each segment as a separate chunk to reduce memory
    //   fragmentation.
    ownedSpace = kj::heapArray<word>(totalWords);
    scratchSpace = ownedSpace;
  }

  segment0 = scratchSpace.slice(0, segment0Size);

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);
    size_t offset = segment0Size;

    for (uint i = 0; i < segmentCount - 1; i++) {
      uint segmentSize = moreSizes[i].get();
      moreSegments[i] = scratchSpace.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  if (segmentCount == 1) {
    inputStream.read(scratchSpace.begin(), totalWords * sizeof(word));
  } else if (segmentCount > 1) {
    readPos = scratchSpace.asBytes().begin();
    readPos += inputStream.read(readPos, segment0Size * sizeof(word), totalWords * sizeof(word));
  }
}